

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::BaseFab<int>_>::define
          (FabArray<amrex::BaseFab<int>_> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::BaseFab<int>_> *a_factory)

{
  FabFactory<amrex::BaseFab<int>_> *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  Arena *pAVar3;
  
  iVar2 = (*a_factory->_vptr_FabFactory[5])();
  pAVar3 = (this->m_dallocator).m_arena;
  clear(this);
  pFVar1 = (this->m_factory)._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::BaseFab<int>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_false>._M_head_impl;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::BaseFab<int>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_false>._M_head_impl =
       (FabFactory<amrex::BaseFab<int>_> *)CONCAT44(extraout_var,iVar2);
  if (pFVar1 != (FabFactory<amrex::BaseFab<int>_> *)0x0) {
    (*pFVar1->_vptr_FabFactory[1])();
  }
  if (info->arena != (Arena *)0x0) {
    pAVar3 = info->arena;
  }
  (this->m_dallocator).m_arena = pAVar3;
  this->define_function_called = true;
  FabArrayBase::define(&this->super_FabArrayBase,bxs,dm,nvar,ngrow);
  FabArrayBase::addThisBD(&this->super_FabArrayBase);
  if (info->alloc == true) {
    AllocFabs(this,(this->m_factory)._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::BaseFab<int>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
                   .super__Head_base<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_false>.
                   _M_head_impl,(this->m_dallocator).m_arena,&info->tags);
    Gpu::Device::streamSynchronizeAll();
    return;
  }
  return;
}

Assistant:

void
FabArray<FAB>::define (const BoxArray&            bxs,
                       const DistributionMapping& dm,
                       int                        nvar,
                       const IntVect&             ngrow,
                       const MFInfo&              info,
                       const FabFactory<FAB>&     a_factory)
{
    std::unique_ptr<FabFactory<FAB> > factory(a_factory.clone());

    auto default_arena = m_dallocator.m_arena;
    clear();

    m_factory = std::move(factory);
    m_dallocator.m_arena = info.arena ? info.arena : default_arena;

    define_function_called = true;

    BL_ASSERT(ngrow.allGE(IntVect::TheZeroVector()));
    BL_ASSERT(boxarray.size() == 0);
    FabArrayBase::define(bxs, dm, nvar, ngrow);

    addThisBD();

    if(info.alloc) {
        AllocFabs(*m_factory, m_dallocator.m_arena, info.tags);
        Gpu::streamSynchronizeAll();
#ifdef BL_USE_TEAM
        ParallelDescriptor::MyTeam().MemoryBarrier();
#endif
    }
}